

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::init_predict(Solver *this)

{
  string *psVar1;
  string *psVar2;
  Reader *pRVar3;
  uint uVar4;
  int iVar5;
  ThreadPool *this_00;
  Model *this_01;
  ostream *poVar6;
  Score *pSVar7;
  Loss *this_02;
  size_t sVar8;
  Timer *this_03;
  ulong threads;
  float fVar9;
  allocator local_6e;
  allocator local_6d;
  undefined1 local_6c [4];
  string local_68;
  string local_48;
  Timer timer;
  
  uVar4 = std::thread::hardware_concurrency();
  sVar8 = (size_t)(this->hyper_param_).thread_number;
  threads = (ulong)uVar4;
  if (sVar8 != 0) {
    threads = sVar8;
  }
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,threads);
  this->pool_ = this_00;
  StringPrintf_abi_cxx11_
            ((string *)(local_6c + 4),"xLearn uses %i threads for prediction task.",threads);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  std::__cxx11::string::string((string *)(local_6c + 4),"Load model ...",(allocator *)&local_48);
  Color::print_action((string *)(local_6c + 4));
  std::__cxx11::string::~string((string *)(local_6c + 4));
  if ((this->hyper_param_).model_file._M_string_length == 0) {
    timer.begin.__d.__r._0_4_ = 2;
    std::__cxx11::string::string
              ((string *)(local_6c + 4),
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,(allocator *)local_6c);
    std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6e);
    poVar6 = Logger::Start(ERR,(string *)(local_6c + 4),0x1a1,&local_48);
    poVar6 = std::operator<<(poVar6,"CHECK_NE failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1a1);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"hyper_param_.model_file.empty()");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)(local_6c + 4));
    this_03 = &timer;
    goto LAB_0013c028;
  }
  psVar2 = &(this->hyper_param_).model_file;
  StringPrintf_abi_cxx11_((string *)(local_6c + 4),"Load model from %s",(psVar2->_M_dataplus)._M_p);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  Timer::Timer(&timer);
  Timer::tic(&timer);
  this_01 = (Model *)operator_new(0x90);
  Model::Model(this_01,psVar2);
  psVar2 = &(this->hyper_param_).score_func;
  this->model_ = this_01;
  std::__cxx11::string::_M_assign((string *)psVar2);
  psVar1 = &(this->hyper_param_).loss_func;
  std::__cxx11::string::_M_assign((string *)psVar1);
  (this->hyper_param_).num_feature = this->model_->num_feat_;
  iVar5 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar5 == 0) {
LAB_0013b7cd:
    (this->hyper_param_).num_K = this->model_->num_K_;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar5 == 0) goto LAB_0013b7cd;
  }
  iVar5 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar5 == 0) {
    (this->hyper_param_).num_field = this->model_->num_field_;
  }
  StringPrintf_abi_cxx11_((string *)(local_6c + 4),"Loss function: %s",(psVar1->_M_dataplus)._M_p);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  StringPrintf_abi_cxx11_((string *)(local_6c + 4),"Score function: %s",(psVar2->_M_dataplus)._M_p);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  StringPrintf_abi_cxx11_
            ((string *)(local_6c + 4),"Number of Feature: %d",
             (ulong)(this->hyper_param_).num_feature);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  iVar5 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar5 == 0) {
LAB_0013b8b0:
    StringPrintf_abi_cxx11_
              ((string *)(local_6c + 4),"Number of K: %d",(ulong)(this->hyper_param_).num_K);
    Color::print_info((string *)(local_6c + 4),false);
    std::__cxx11::string::~string((string *)(local_6c + 4));
    iVar5 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar5 == 0) {
      StringPrintf_abi_cxx11_
                ((string *)(local_6c + 4),"Number of field: %d",
                 (ulong)(this->hyper_param_).num_field);
      Color::print_info((string *)(local_6c + 4),false);
      std::__cxx11::string::~string((string *)(local_6c + 4));
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar5 == 0) goto LAB_0013b8b0;
  }
  fVar9 = Timer::toc(&timer);
  StringPrintf_abi_cxx11_
            ((string *)(local_6c + 4),"Time cost for loading model: %.2f (sec)",(double)fVar9);
  Color::print_info((string *)(local_6c + 4),false);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  local_6c = (undefined1  [4])0x0;
  std::__cxx11::string::string
            ((string *)(local_6c + 4),
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,&local_6e);
  std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
  poVar6 = Logger::Start(INFO,(string *)(local_6c + 4),0x1d0,&local_48);
  std::operator<<(poVar6,"Initialize model.");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  Logger::~Logger((Logger *)local_6c);
  std::__cxx11::string::string((string *)(local_6c + 4),"Read Problem ...",(allocator *)&local_48);
  Color::print_action((string *)(local_6c + 4));
  std::__cxx11::string::~string((string *)(local_6c + 4));
  Timer::reset(&timer);
  Timer::tic(&timer);
  local_68._M_dataplus._M_p = (pointer)create_reader(this);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
            (&this->reader_,1,(value_type *)(local_6c + 4));
  if ((this->hyper_param_).from_file == true) {
    if ((this->hyper_param_).test_set_file._M_string_length != 0) {
      psVar2 = &(this->hyper_param_).test_set_file;
      Reader::SetBlockSize
                (*(this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)(this->hyper_param_).block_size);
      pRVar3 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar3->_vptr_Reader[2])(pRVar3,psVar2);
      pRVar3 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar3->_vptr_Reader[8])(pRVar3,0);
      if (*(this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
           _M_impl.super__Vector_impl_data._M_start != (Reader *)0x0) {
LAB_0013bb2a:
        fVar9 = Timer::toc(&timer);
        StringPrintf_abi_cxx11_
                  ((string *)(local_6c + 4),"Time cost for reading problem: %.2f (sec)",
                   (double)fVar9);
        Color::print_info((string *)(local_6c + 4),false);
        std::__cxx11::string::~string((string *)(local_6c + 4));
        local_6c = (undefined1  [4])0x0;
        std::__cxx11::string::string
                  ((string *)(local_6c + 4),
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,&local_6e);
        std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
        poVar6 = Logger::Start(INFO,(string *)(local_6c + 4),0x1f6,&local_48);
        poVar6 = std::operator<<(poVar6,"Initialize Reader: ");
        std::operator<<(poVar6,(string *)&(this->hyper_param_).test_set_file);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)(local_6c + 4));
        Logger::~Logger((Logger *)local_6c);
        pSVar7 = create_score(this);
        this->score_ = pSVar7;
        local_6c = (undefined1  [4])0x0;
        std::__cxx11::string::string
                  ((string *)(local_6c + 4),
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,&local_6e);
        std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
        poVar6 = Logger::Start(INFO,(string *)(local_6c + 4),0x1fb,&local_48);
        std::operator<<(poVar6,"Initialize score function.");
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)(local_6c + 4));
        Logger::~Logger((Logger *)local_6c);
        this_02 = create_loss(this);
        this->loss_ = this_02;
        Loss::Initialize(this_02,this->score_,this->pool_,(this->hyper_param_).norm,false,0);
        local_6c = (undefined1  [4])0x0;
        std::__cxx11::string::string
                  ((string *)(local_6c + 4),
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,&local_6e);
        std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
        poVar6 = Logger::Start(INFO,(string *)(local_6c + 4),0x201,&local_48);
        std::operator<<(poVar6,"Initialize score function.");
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)(local_6c + 4));
        Logger::~Logger((Logger *)local_6c);
        return;
      }
      StringPrintf_abi_cxx11_
                ((string *)(local_6c + 4),"Cannot open the file %s",(psVar2->_M_dataplus)._M_p);
      Color::print_info((string *)(local_6c + 4),false);
LAB_0013c059:
      std::__cxx11::string::~string((string *)(local_6c + 4));
      exit(0);
    }
    local_6c = (undefined1  [4])0x2;
    std::__cxx11::string::string
              ((string *)(local_6c + 4),
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_6e);
    std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
    poVar6 = Logger::Start(ERR,(string *)(local_6c + 4),0x1da,&local_48);
    poVar6 = std::operator<<(poVar6,"CHECK_NE failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1da);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"hyper_param_.test_set_file.empty()");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"true");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    std::operator<<(poVar6,"\n");
  }
  else {
    if ((this->hyper_param_).test_dataset != (DMatrix *)0x0) {
      Reader::SetBlockSize
                (*(this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)(this->hyper_param_).block_size);
      pRVar3 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar3->_vptr_Reader[3])(pRVar3,&(this->hyper_param_).test_dataset);
      pRVar3 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar3->_vptr_Reader[8])(pRVar3,0);
      if (*(this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
           _M_impl.super__Vector_impl_data._M_start != (Reader *)0x0) goto LAB_0013bb2a;
      StringPrintf_abi_cxx11_
                ((string *)(local_6c + 4),"Cannot open the file %s",
                 (this->hyper_param_).test_set_file._M_dataplus._M_p);
      Color::print_info((string *)(local_6c + 4),false);
      goto LAB_0013c059;
    }
    local_6c = (undefined1  [4])0x2;
    std::__cxx11::string::string
              ((string *)(local_6c + 4),
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_6e);
    std::__cxx11::string::string((string *)&local_48,"init_predict",&local_6d);
    poVar6 = Logger::Start(ERR,(string *)(local_6c + 4),0x1e6,&local_48);
    poVar6 = std::operator<<(poVar6,"CHECK failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e6);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"hyper_param_.test_dataset");
    std::operator<<(poVar6," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)(local_6c + 4));
  this_03 = (Timer *)local_6c;
LAB_0013c028:
  Logger::~Logger((Logger *)this_03);
  abort();
}

Assistant:

void Solver::init_predict() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for prediction task.",
             threadNumber)
  );
  /*********************************************************
   *  Read model file                                      *
   *********************************************************/
  Color::print_action("Load model ...");
  CHECK_NE(hyper_param_.model_file.empty(), true);
  Color::print_info(
    StringPrintf("Load model from %s",
          hyper_param_.model_file.c_str())
  );
  Timer timer;
  timer.tic();
  model_ = new Model(hyper_param_.model_file);
  hyper_param_.score_func = model_->GetScoreFunction();
  hyper_param_.loss_func = model_->GetLossFunction();
  hyper_param_.num_feature = model_->GetNumFeature();
  if (hyper_param_.score_func.compare("fm") == 0 ||
       hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_K = model_->GetNumK();
  }
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = model_->GetNumField();
  }
  Color::print_info(
    StringPrintf("Loss function: %s", 
      hyper_param_.loss_func.c_str())
  );
  Color::print_info(
    StringPrintf("Score function: %s", 
      hyper_param_.score_func.c_str())
  );
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("fm") == 0 ||
      hyper_param_.score_func.compare("ffm") == 0) {
    Color::print_info(
      StringPrintf("Number of K: %d", 
                   hyper_param_.num_K)
    );
    if (hyper_param_.score_func.compare("ffm") == 0) {
      Color::print_info(
        StringPrintf("Number of field: %d", 
                    hyper_param_.num_field)
      );
    }
  }
  Color::print_info(
    StringPrintf("Time cost for loading model: %.2f (sec)",
        timer.toc())
  );
  LOG(INFO) << "Initialize model.";
  /*********************************************************
   *  Initialize Reader and read problem                   *
   *********************************************************/
  Color::print_action("Read Problem ...");
  timer.reset();
  timer.tic();
  // Create Reader
  reader_.resize(1, create_reader());
  if (hyper_param_.from_file) {
    CHECK_NE(hyper_param_.test_set_file.empty(), true);
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_set_file);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  } else {
    CHECK_NOTNULL(hyper_param_.test_dataset)
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_dataset);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
                  timer.toc())
  );
  LOG(INFO) << "Initialize Reader: " << hyper_param_.test_set_file;
  /*********************************************************
   *  Init score function                                  *
   *********************************************************/
  score_ = create_score();
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Init loss function                                   *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, hyper_param_.norm);
  LOG(INFO) << "Initialize score function.";
}